

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void suffixedexp(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *fs;
  expdesc key;
  expdesc local_40;
  
  fs = ls->fs;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x123) {
    singlevar(ls,v);
  }
  else {
    if (iVar1 != 0x28) {
      luaX_syntaxerror(ls,"unexpected symbol");
    }
    iVar1 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0);
    check_match(ls,0x29,0x28,iVar1);
    luaK_dischargevars(ls->fs,v);
  }
LAB_0011daaa:
  while (iVar1 = (ls->t).token, 0x5a < iVar1) {
    if (iVar1 != 0x5b) {
      if ((iVar1 != 0x7b) && (iVar1 != 0x124)) {
        return;
      }
      goto LAB_0011db10;
    }
    luaK_exp2anyregup(fs,v);
    yindex(ls,&local_40);
    luaK_indexed(fs,v,&local_40);
  }
  if (iVar1 == 0x28) {
LAB_0011db10:
    luaK_exp2nextreg(fs,v);
  }
  else {
    if (iVar1 == 0x2e) {
      fieldsel(ls,v);
      goto LAB_0011daaa;
    }
    if (iVar1 != 0x3a) {
      return;
    }
    luaX_next(ls);
    local_40.u.strval = str_checkname(ls);
    local_40.t = -1;
    local_40.f = -1;
    local_40.k = VKSTR;
    luaK_self(fs,v,&local_40);
  }
  funcargs(ls,v);
  goto LAB_0011daaa;
}

Assistant:

static void suffixedexp (LexState *ls, expdesc *v) {
  /* suffixedexp ->
       primaryexp { '.' NAME | '[' exp ']' | ':' NAME funcargs | funcargs } */
  FuncState *fs = ls->fs;
  primaryexp(ls, v);
  for (;;) {
    switch (ls->t.token) {
      case '.': {  /* fieldsel */
        fieldsel(ls, v);
        break;
      }
      case '[': {  /* '[' exp ']' */
        expdesc key;
        luaK_exp2anyregup(fs, v);
        yindex(ls, &key);
        luaK_indexed(fs, v, &key);
        break;
      }
      case ':': {  /* ':' NAME funcargs */
        expdesc key;
        luaX_next(ls);
        codename(ls, &key);
        luaK_self(fs, v, &key);
        funcargs(ls, v);
        break;
      }
      case '(': case TK_STRING: case '{': {  /* funcargs */
        luaK_exp2nextreg(fs, v);
        funcargs(ls, v);
        break;
      }
      default: return;
    }
  }
}